

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O0

void __thiscall
FNodeBuilder::FindPolyContainers
          (FNodeBuilder *this,TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *spots,
          TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *anchors)

{
  bool bVar1;
  uint uVar2;
  fixed_t fVar3;
  fixed_t fVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  SDWORD SVar8;
  FPolyStart *pFVar9;
  FPrivSeg *pFVar10;
  FPrivVert *pFVar11;
  FPrivVert *pFVar12;
  fixed_t dist;
  fixed_t sx;
  fixed_t t;
  fixed_t dx;
  fixed_t dy;
  FPrivVert *v2;
  FPrivVert *v1;
  FPrivSeg *seg;
  DWORD local_d0;
  uint j_1;
  uint closestseg;
  fixed_t closestdist;
  vertex_t center;
  vertex_t mid;
  FPolyStart *pFStack_50;
  uint j;
  FPolyStart *anchor;
  fixed_t bbox [4];
  FPolyStart *spot;
  uint i;
  int loop;
  TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *anchors_local;
  TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *spots_local;
  FNodeBuilder *this_local;
  
  spot._4_4_ = 1;
  for (spot._0_4_ = 0;
      uVar2 = TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart>::Size(spots),
      (uint)spot < uVar2; spot._0_4_ = (uint)spot + 1) {
    pFVar9 = TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart>::operator[]
                       (spots,(ulong)(uint)spot);
    bVar1 = GetPolyExtents(this,pFVar9->polynum,(fixed_t *)&anchor);
    if (bVar1) {
      pFStack_50 = (FPolyStart *)0x0;
      mid.heightlist._4_4_ = 0;
      while ((uVar2 = TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart>::Size(anchors),
             mid.heightlist._4_4_ < uVar2 &&
             (pFStack_50 = TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart>::operator[]
                                     (anchors,(ulong)mid.heightlist._4_4_),
             pFStack_50->polynum != pFVar9->polynum))) {
        mid.heightlist._4_4_ = mid.heightlist._4_4_ + 1;
      }
      uVar2 = TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart>::Size(anchors);
      if (mid.heightlist._4_4_ < uVar2) {
        vertex_t::vertex_t((vertex_t *)&center.heightlist);
        vertex_t::vertex_t((vertex_t *)&closestseg);
        vertex_t::set((vertex_t *)&center.heightlist,bbox[0] + (bbox[1] - bbox[0]) / 2,
                      anchor._4_4_ + ((int)anchor - anchor._4_4_) / 2);
        fVar3 = vertex_t::fixX((vertex_t *)&center.heightlist);
        iVar5 = pFStack_50->x;
        iVar6 = pFVar9->x;
        fVar4 = vertex_t::fixY((vertex_t *)&center.heightlist);
        vertex_t::set((vertex_t *)&closestseg,(fVar3 - iVar5) + iVar6,
                      (fVar4 - pFStack_50->y) + pFVar9->y);
        j_1 = 0x7fffffff;
        local_d0 = 0xffffffff;
        for (seg._4_4_ = 0;
            uVar2 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Size(&this->Segs),
            seg._4_4_ < uVar2; seg._4_4_ = seg._4_4_ + 1) {
          pFVar10 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                              (&this->Segs,(ulong)seg._4_4_);
          pFVar11 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                              (&this->Vertices,(long)pFVar10->v1);
          pFVar12 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                              (&this->Vertices,(long)pFVar10->v2);
          iVar5 = (pFVar12->super_FSimpleVert).y - (pFVar11->super_FSimpleVert).y;
          if (((iVar5 != 0) &&
              ((iVar6 = (pFVar11->super_FSimpleVert).y,
               fVar3 = vertex_t::fixY((vertex_t *)&closestseg), fVar3 <= iVar6 ||
               (iVar6 = (pFVar12->super_FSimpleVert).y,
               fVar3 = vertex_t::fixY((vertex_t *)&closestseg), fVar3 <= iVar6)))) &&
             ((iVar6 = (pFVar11->super_FSimpleVert).y,
              fVar3 = vertex_t::fixY((vertex_t *)&closestseg), iVar6 <= fVar3 ||
              (iVar6 = (pFVar12->super_FSimpleVert).y,
              fVar3 = vertex_t::fixY((vertex_t *)&closestseg), iVar6 <= fVar3)))) {
            iVar6 = (pFVar12->super_FSimpleVert).x - (pFVar11->super_FSimpleVert).x;
            fVar3 = vertex_t::fixX((vertex_t *)&closestseg);
            fVar4 = vertex_t::fixY((vertex_t *)&closestseg);
            iVar7 = PointOnSide(fVar3,fVar4,(pFVar11->super_FSimpleVert).x,
                                (pFVar11->super_FSimpleVert).y,iVar6,iVar5);
            if (iVar7 < 1) {
              fVar3 = vertex_t::fixY((vertex_t *)&closestseg);
              SVar8 = DivScale30(fVar3 - (pFVar11->super_FSimpleVert).y,iVar5);
              iVar5 = (pFVar11->super_FSimpleVert).x;
              SVar8 = MulScale30(iVar6,SVar8);
              uVar2 = (iVar5 + SVar8) - pFVar9->x;
              if (((int)uVar2 < (int)j_1) && (-1 < (int)uVar2)) {
                local_d0 = seg._4_4_;
                j_1 = uVar2;
              }
            }
          }
        }
        if (local_d0 != 0xffffffff) {
          spot._4_4_ = MarkLoop(this,local_d0,spot._4_4_);
        }
      }
    }
  }
  return;
}

Assistant:

void FNodeBuilder::FindPolyContainers (TArray<FPolyStart> &spots, TArray<FPolyStart> &anchors)
{
	int loop = 1;

	for (unsigned int i = 0; i < spots.Size(); ++i)
	{
		FPolyStart *spot = &spots[i];
		fixed_t bbox[4];

		if (GetPolyExtents (spot->polynum, bbox))
		{
			FPolyStart *anchor = NULL;

			unsigned int j;

			for (j = 0; j < anchors.Size(); ++j)
			{
				anchor = &anchors[j];
				if (anchor->polynum == spot->polynum)
				{
					break;
				}
			}

			if (j < anchors.Size())
			{
				vertex_t mid;
				vertex_t center;

				mid.set(bbox[BOXLEFT] + (bbox[BOXRIGHT]-bbox[BOXLEFT])/2,
						bbox[BOXBOTTOM] + (bbox[BOXTOP]-bbox[BOXBOTTOM])/2);

				center.set(mid.fixX() - anchor->x + spot->x,
							mid.fixY() - anchor->y + spot->y);

				// Scan right for the seg closest to the polyobject's center after it
				// gets moved to its start spot.
				fixed_t closestdist = FIXED_MAX;
				unsigned int closestseg = UINT_MAX;

				P(Printf ("start %d,%d -- center %d, %d\n", spot->x>>16, spot->y>>16, center.fixX()>>16, center.fixY()>>16));

				for (unsigned int j = 0; j < Segs.Size(); ++j)
				{
					FPrivSeg *seg = &Segs[j];
					FPrivVert *v1 = &Vertices[seg->v1];
					FPrivVert *v2 = &Vertices[seg->v2];
					fixed_t dy = v2->y - v1->y;

					if (dy == 0)
					{ // Horizontal, so skip it
						continue;
					}
					if ((v1->y < center.fixY() && v2->y < center.fixY()) || (v1->y > center.fixY() && v2->y > center.fixY()))
					{ // Not crossed
						continue;
					}

					fixed_t dx = v2->x - v1->x;

					if (PointOnSide (center.fixX(), center.fixY(), v1->x, v1->y, dx, dy) <= 0)
					{
						fixed_t t = DivScale30 (center.fixY() - v1->y, dy);
						fixed_t sx = v1->x + MulScale30 (dx, t);
						fixed_t dist = sx - spot->x;

						if (dist < closestdist && dist >= 0)
						{
							closestdist = dist;
							closestseg = (long)j;
						}
					}
				}
				if (closestseg != UINT_MAX)
				{
					loop = MarkLoop (closestseg, loop);
					P(Printf ("Found polyobj in sector %d (loop %d)\n", Segs[closestseg].frontsector,
						Segs[closestseg].loopnum));
				}
			}
		}
	}
}